

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HModel.cpp
# Opt level: O0

void __thiscall HModel::copy_impliedBoundsToModelBounds(HModel *this)

{
  reference pvVar1;
  long in_RDI;
  double *in_stack_00000008;
  double *in_stack_00000010;
  HModel *in_stack_00000018;
  int i_1;
  int i;
  size_type in_stack_ffffffffffffffd8;
  value_type vVar2;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffffe0;
  undefined4 local_10;
  undefined4 local_c;
  
  std::vector<double,_std::allocator<double>_>::resize
            (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  std::vector<double,_std::allocator<double>_>::resize
            (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  std::vector<double,_std::allocator<double>_>::resize
            (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  std::vector<double,_std::allocator<double>_>::resize
            (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  for (local_c = 0; local_c < *(int *)(in_RDI + 0x60c); local_c = local_c + 1) {
    pvVar1 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x6a8),(long)local_c);
    vVar2 = *pvVar1;
    pvVar1 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x1130),(long)local_c);
    *pvVar1 = vVar2;
    pvVar1 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x6c0),(long)local_c);
    vVar2 = *pvVar1;
    pvVar1 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x1148),(long)local_c);
    *pvVar1 = vVar2;
  }
  for (local_10 = 0; local_10 < *(int *)(in_RDI + 0x610); local_10 = local_10 + 1) {
    pvVar1 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x6f0),(long)local_10);
    vVar2 = *pvVar1;
    pvVar1 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x1160),(long)local_10)
    ;
    *pvVar1 = vVar2;
    pvVar1 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x708),(long)local_10);
    vVar2 = *pvVar1;
    pvVar1 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x1178),(long)local_10)
    ;
    *pvVar1 = vVar2;
  }
  *(undefined4 *)(in_RDI + 0x608) = 1;
  *(undefined1 *)(in_RDI + 0x57d) = 1;
  std::vector<double,_std::allocator<double>_>::operator[]
            ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x1070),0);
  std::vector<double,_std::allocator<double>_>::operator[]
            ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x1088),0);
  util_chgColBoundsAll(in_stack_00000018,in_stack_00000010,in_stack_00000008);
  std::vector<double,_std::allocator<double>_>::operator[]
            ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x10a0),0);
  std::vector<double,_std::allocator<double>_>::operator[]
            ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x10b8),0);
  util_chgRowBoundsAll(in_stack_00000018,in_stack_00000010,in_stack_00000008);
  return;
}

Assistant:

void HModel::copy_impliedBoundsToModelBounds() {
  //Save copies of the current model bounds
  SvColLower.resize(numCol);
  SvColUpper.resize(numCol);
  SvRowLower.resize(numRow);
  SvRowUpper.resize(numRow);
  for (int i = 0; i < numCol; i++) {
    SvColLower[i] = colLower[i];
    SvColUpper[i] = colUpper[i];
  }
  for (int i = 0; i < numRow; i++) {
    SvRowLower[i] = rowLower[i];
    SvRowUpper[i] = rowUpper[i];
  }
  // Indicate that there are saved bounds - which must be scaled if the model is scaled
  mlFg_haveSavedBounds = 1;
  // Change to implied bounds
  usingImpliedBoundsPresolve = true;
  util_chgColBoundsAll(&primalColLowerImplied[0], &primalColUpperImplied[0]);
  util_chgRowBoundsAll(&primalRowLowerImplied[0], &primalRowUpperImplied[0]);
}